

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

void __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
          (UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this,
          pair<wasm::Name,_wasm::Name> item)

{
  iterator *piVar1;
  _Elt_pointer ppVar2;
  mapped_type *pmVar3;
  
  ppVar2 = (this->data).c.
           super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 == (this->data).c.
                super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<wasm::Name,wasm::Name>,std::allocator<std::pair<wasm::Name,wasm::Name>>>::
    _M_push_back_aux<std::pair<wasm::Name,wasm::Name>const&>
              ((deque<std::pair<wasm::Name,wasm::Name>,std::allocator<std::pair<wasm::Name,wasm::Name>>>
                *)this,&item);
  }
  else {
    (ppVar2->second).super_IString.str._M_len = item.second.super_IString.str._M_len;
    (ppVar2->second).super_IString.str._M_str = item.second.super_IString.str._M_str;
    (ppVar2->first).super_IString.str._M_len = item.first.super_IString.str._M_len;
    (ppVar2->first).super_IString.str._M_str = item.first.super_IString.str._M_str;
    piVar1 = &(this->data).c.
              super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pmVar3 = std::__detail::
           _Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->count,&item);
  *pmVar3 = *pmVar3 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }